

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml.cpp
# Opt level: O3

void __thiscall despot::util::tinyxml::TiXmlUnknown::Print(TiXmlUnknown *this,FILE *cfile,int depth)

{
  if (0 < depth) {
    do {
      fwrite("    ",4,1,(FILE *)cfile);
      depth = depth + -1;
    } while (depth != 0);
  }
  fprintf((FILE *)cfile,"<%s>",((this->super_TiXmlNode).value.rep_)->str);
  return;
}

Assistant:

void TiXmlUnknown::Print(FILE* cfile, int depth) const {
	for (int i = 0; i < depth; i++)
		fprintf(cfile, "    ");
	fprintf(cfile, "<%s>", value.c_str());
}